

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Del
          (PersistentStorageJson *this,NetworkId *aId)

{
  Status SVar1;
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)JSON_NWK_abi_cxx11_);
  SVar1 = DelId<ot::commissioner::persistent_storage::Network,ot::commissioner::persistent_storage::NetworkId>
                    (this,aId,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Del(NetworkId const &aId)
{
    return DelId<Network, NetworkId>(aId, JSON_NWK);
}